

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetGlobalForceVectorAtSample
          (VClient *this,uint i_PlateID,uint i_Subsample,double (*o_rForceVector) [3])

{
  pointer pVVar1;
  bool bVar2;
  Enum EVar3;
  uint PlateIndex;
  scoped_lock Lock;
  array<double,_3UL> local_b8;
  array<double,_3UL> ForceVector;
  array<double,_3UL> WorldForceVector;
  array<double,_9UL> WorldRotation;
  
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&Lock,&this->m_FrameMutex);
  ClientUtils::Clear<double,3u>(o_rForceVector);
  EVar3 = GetForceVector(this,i_PlateID,i_Subsample,&ForceVector);
  if (EVar3 == Success) {
    bVar2 = ForcePlateDeviceIndex(this,i_PlateID,&PlateIndex);
    if (bVar2) {
      pVVar1 = (this->m_LatestFrame).m_ForcePlates.
               super__Vector_base<ViconCGStream::VForcePlateInfo,_std::allocator<ViconCGStream::VForcePlateInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<float_const*,double*>
                (pVVar1[PlateIndex].m_WorldRotation,pVVar1[PlateIndex].m_Bounds,
                 WorldRotation._M_elems);
      ClientUtils::operator*(&local_b8,&WorldRotation,&ForceVector);
      WorldForceVector._M_elems[2] = local_b8._M_elems[2];
      WorldForceVector._M_elems[0] = local_b8._M_elems[0];
      WorldForceVector._M_elems[1] = local_b8._M_elems[1];
      CopyAndTransformT(this,WorldForceVector._M_elems,o_rForceVector);
      EVar3 = Success;
    }
    else {
      EVar3 = Unknown;
    }
  }
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&Lock);
  return EVar3;
}

Assistant:

Result::Enum VClient::GetGlobalForceVectorAtSample( const unsigned int i_PlateID,
                                            const unsigned int i_Subsample, 
                                            double ( & o_rForceVector)[3] ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Clear( o_rForceVector );

  std::array< double, 3 > ForceVector;

  Result::Enum Result = GetForceVector( i_PlateID, i_Subsample, ForceVector );

  if( Result == Result::Success )
  {
    // Get the plate index.

    unsigned int PlateIndex;
    if( !ForcePlateDeviceIndex( i_PlateID, PlateIndex ) )
    {
      return Result::Unknown;
    }

    // Transform result to global coordinates by rotating by plate orientation.

    const ViconCGStream::VForcePlateInfo & rForcePlate = m_LatestFrame.m_ForcePlates[ PlateIndex ];

    std::array< double, 3 * 3 > WorldRotation;
    std::copy( rForcePlate.m_WorldRotation, rForcePlate.m_WorldRotation + 9, WorldRotation.begin() );

    std::array< double, 3 > WorldForceVector;

    WorldForceVector = WorldRotation * ForceVector;

    CopyAndTransformT( WorldForceVector.data(), o_rForceVector );
  }

  return Result;
}